

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ClearIniSettings(void)

{
  ImGuiSettingsHandler *pIVar1;
  code *pcVar2;
  ImGuiContext_conflict1 *pIVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  pIVar3 = GImGui;
  ImGuiTextBuffer::clear(&GImGui->SettingsIniData);
  iVar4 = (pIVar3->SettingsHandlers).Size;
  if (0 < iVar4) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      pIVar1 = (pIVar3->SettingsHandlers).Data;
      pcVar2 = *(code **)((long)&pIVar1->ClearAllFn + lVar5);
      if (pcVar2 != (code *)0x0) {
        (*pcVar2)(pIVar3,(long)&pIVar1->TypeName + lVar5);
        iVar4 = (pIVar3->SettingsHandlers).Size;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x48;
    } while (lVar6 < iVar4);
  }
  return;
}

Assistant:

void ImGui::ClearIniSettings()
{
    ImGuiContext& g = *GImGui;
    g.SettingsIniData.clear();
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
        if (g.SettingsHandlers[handler_n].ClearAllFn)
            g.SettingsHandlers[handler_n].ClearAllFn(&g, &g.SettingsHandlers[handler_n]);
}